

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string_view name,string_view relative_to,ResolveMode resolve_mode
          ,bool build_it)

{
  uint8_t uVar1;
  string_view name_00;
  size_type sVar2;
  bool bVar3;
  size_type __n;
  ulong uVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view name_01;
  string_view name_02;
  string_view name_local;
  Symbol local_d8;
  ResolveMode local_cc;
  string scope_to_try;
  string_view relative_to_local;
  AlphaNum local_90;
  AlphaNum local_60;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  relative_to_local._M_str = relative_to._M_str;
  relative_to_local._M_len = relative_to._M_len;
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  (this->undefine_resolved_name_)._M_string_length = 0;
  *(this->undefine_resolved_name_)._M_dataplus._M_p = '\0';
  local_cc = resolve_mode;
  if ((name_local._M_len == 0) || (*name_local._M_str != '.')) {
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&name_local,'.',0);
    if (__n == 0xffffffffffffffff) {
      bVar5._M_str = name_local._M_str;
      bVar5._M_len = name_local._M_len;
    }
    else {
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&name_local,0,__n);
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&scope_to_try,&relative_to_local,(allocator<char> *)&local_90);
    while( true ) {
      uVar4 = std::__cxx11::string::rfind((char)&scope_to_try,0x2e);
      if (uVar4 == 0xffffffffffffffff) break;
      std::__cxx11::string::erase((ulong)&scope_to_try,uVar4);
      sVar2 = scope_to_try._M_string_length;
      local_90.piece_ = absl::lts_20250127::NullSafeStringView(".");
      local_60.piece_ = bVar5;
      absl::lts_20250127::StrAppend(&scope_to_try,&local_90,&local_60);
      name_01._M_str = scope_to_try._M_dataplus._M_p;
      name_01._M_len = scope_to_try._M_string_length;
      local_d8 = FindSymbol(this,name_01,build_it);
      uVar1 = (local_d8.ptr_)->symbol_type_;
      if (uVar1 != '\0') {
        if (bVar5._M_len < name_local._M_len) {
          bVar3 = Symbol::IsAggregate(&local_d8);
          if (bVar3) {
            local_90.piece_ =
                 std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&name_local,bVar5._M_len,0xffffffffffffffff);
            absl::lts_20250127::StrAppend(&scope_to_try,&local_90);
            name_02._M_str = scope_to_try._M_dataplus._M_p;
            name_02._M_len = scope_to_try._M_string_length;
            local_d8 = FindSymbol(this,name_02,build_it);
            if ((local_d8.ptr_)->symbol_type_ == '\0') {
              std::__cxx11::string::_M_assign((string *)&this->undefine_resolved_name_);
            }
            goto LAB_001d1e45;
          }
        }
        else if (((local_cc != LOOKUP_TYPES) || (uVar1 == '\x01')) || (uVar1 == '\x04'))
        goto LAB_001d1e45;
      }
      std::__cxx11::string::erase((ulong)&scope_to_try,sVar2);
    }
    name_00._M_str = name_local._M_str;
    name_00._M_len = name_local._M_len;
    local_d8 = FindSymbol(this,name_00,build_it);
LAB_001d1e45:
    std::__cxx11::string::~string((string *)&scope_to_try);
  }
  else {
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&name_local,1,0xffffffffffffffff);
    local_d8 = FindSymbol(this,bVar5,build_it);
  }
  return (Symbol)local_d8.ptr_;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(
    const absl::string_view name, const absl::string_view relative_to,
    ResolveMode resolve_mode, bool build_it) {
  possible_undeclared_dependency_ = nullptr;
  undefine_resolved_name_.clear();

  if (!name.empty() && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1), build_it);
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  std::string::size_type name_dot_pos = name.find_first_of('.');
  absl::string_view first_part_of_name;
  if (name_dot_pos == std::string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  std::string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    std::string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == std::string::npos) {
      return FindSymbol(name, build_it);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    std::string::size_type old_size = scope_to_try.size();
    absl::StrAppend(&scope_to_try, ".", first_part_of_name);
    Symbol result = FindSymbol(scope_to_try, build_it);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          absl::StrAppend(&scope_to_try,
                          name.substr(first_part_of_name.size()));
          result = FindSymbol(scope_to_try, build_it);
          if (result.IsNull()) {
            undefine_resolved_name_ = scope_to_try;
          }
          return result;
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}